

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void address_space_dispatch_free_mipsel(AddressSpaceDispatch *d)

{
  AddressSpaceDispatch *d_local;
  
  phys_sections_free(&d->map);
  g_free(d);
  return;
}

Assistant:

void address_space_dispatch_free(AddressSpaceDispatch *d)
{
    phys_sections_free(&d->map);
    g_free(d);
}